

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

int cmphstr(char **p1,char *p2,bool allowParenthesisEnd)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  uint local_28;
  uint i;
  bool allowParenthesisEnd_local;
  char *p2_local;
  char **p1_local;
  
  local_28 = 0;
  while( true ) {
    bVar3 = false;
    if (p2[local_28] != '\0') {
      iVar2 = isalpha((uint)(byte)p2[local_28]);
      bVar3 = iVar2 == 0;
    }
    if (!bVar3) break;
    if ((*p1)[local_28] != p2[local_28]) {
      return 0;
    }
    local_28 = local_28 + 1;
  }
  iVar2 = isupper((uint)(byte)(*p1)[local_28]);
  if (iVar2 == 0) {
    for (; p2[local_28] != '\0'; local_28 = local_28 + 1) {
      if ((*p1)[local_28] != p2[local_28]) {
        return 0;
      }
    }
  }
  else {
    for (; p2[local_28] != '\0'; local_28 = local_28 + 1) {
      cVar1 = (*p1)[local_28];
      iVar2 = toupper((uint)(byte)p2[local_28]);
      if (cVar1 != iVar2) {
        return 0;
      }
    }
  }
  if (((((((*p1)[local_28] != '\0') && (bVar3 = White((*p1)[local_28]), !bVar3)) &&
        ((*p1)[local_28] != ';')) && (((*p1)[local_28] != '/' || ((*p1)[local_28 + 1] != '/')))) &&
      (((*p1)[local_28] != '/' || ((*p1)[local_28 + 1] != '*')))) &&
     ((!allowParenthesisEnd || ((*p1)[local_28] != '(')))) {
    return 0;
  }
  *p1 = *p1 + local_28;
  return 1;
}

Assistant:

int cmphstr(char*& p1, const char* p2, bool allowParenthesisEnd) {
	unsigned int i = 0;
	// check initial non-alpha chars without deciding the upper/lower case of test
	while (p2[i] && !isalpha((byte)p2[i])) {
		if (p1[i] != p2[i]) return 0;
		++i;
	}
	// now the first alpha char will make whole test upper or lower case like.
	if (isupper((byte)p1[i])) {
		while (p2[i]) {
			if (p1[i] != toupper((byte)p2[i])) return 0;
			++i;
		}
	} else {
		while (p2[i]) {
			if (p1[i] != p2[i]) return 0;
			++i;
		}
	}
	if (p1[i]) {		// there is some character after the first word
		// whitespace, EOL-comment and block-comment-start keep the match valid
		// also starting parenthesis when allowParenthesisEnd
		if (
			!White(p1[i]) && \
			!(';' == p1[i]) && \
			!('/' == p1[i] && '/' == p1[i+1]) && \
			!('/' == p1[i] && '*' == p1[i+1]) && \
			!(allowParenthesisEnd && '(' == p1[i])
		) {
			return 0;	// anything else invalidates the found match
		}
	}
	// space, tab, enter, \0, ... => "match"
	p1 += i;
	return 1;
}